

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O0

void __thiscall
QGraphicsGridLayout::addItem
          (QGraphicsGridLayout *this,QGraphicsLayoutItem *item,int row,int column,int rowSpan,
          int columnSpan,Alignment alignment)

{
  QGraphicsGridLayoutPrivate *pQVar1;
  void *pvVar2;
  uint in_ECX;
  uint in_EDX;
  QGraphicsGridLayoutEngineItem *in_RSI;
  QGraphicsGridLayoutEngineItem *in_RDI;
  uint in_R8D;
  uint in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  QGraphicsGridLayoutEngineItem *gridEngineItem;
  QGraphicsGridLayoutPrivate *d;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  int line;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::AlignmentFlag> alignment_00;
  char local_90 [32];
  char local_70 [32];
  char local_50 [32];
  char local_30 [36];
  int local_c;
  long local_8;
  
  alignment_00.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  pQVar1 = d_func((QGraphicsGridLayout *)0x96d1d5);
  if (((int)in_EDX < 0) || ((int)in_ECX < 0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),line,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if ((int)in_EDX < 0) {
      in_ECX = in_EDX;
    }
    QMessageLogger::warning
              (local_30,"QGraphicsGridLayout::addItem: invalid row/column: %d",(ulong)in_ECX);
  }
  else if (((int)in_R9D < 1) || ((int)in_R8D < 1)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),line,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if ((int)in_R8D < 1) {
      in_R9D = in_R8D;
    }
    QMessageLogger::warning
              (local_50,"QGraphicsGridLayout::addItem: invalid row span/column span: %d",
               (ulong)in_R9D);
  }
  else if (in_RSI == (QGraphicsGridLayoutEngineItem *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),line,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning(local_70,"QGraphicsGridLayout::addItem: cannot add null item");
  }
  else if (in_RSI == in_RDI) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),line,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning(local_90,"QGraphicsGridLayout::addItem: cannot insert itself");
  }
  else {
    QGraphicsLayoutPrivate::addChildLayoutItem
              ((QGraphicsLayoutPrivate *)CONCAT44(in_EDX,in_ECX),
               (QGraphicsLayoutItem *)CONCAT44(in_R8D,in_R9D));
    pvVar2 = operator_new(0x30);
    QGraphicsGridLayoutEngineItem::QGraphicsGridLayoutEngineItem
              (in_RDI,(QGraphicsLayoutItem *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (int)((ulong)pvVar2 >> 0x20),(int)pvVar2,in_stack_ffffffffffffff1c,local_c,
               (Alignment)alignment_00.i);
    QGridLayoutEngine::insertItem((QGridLayoutItem *)&pQVar1->engine,(int)pvVar2);
    (**(code **)(*(long *)in_RDI + 0x38))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsGridLayout::addItem(QGraphicsLayoutItem *item, int row, int column,
                                  int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGraphicsGridLayout);
    if (row < 0 || column < 0) {
        qWarning("QGraphicsGridLayout::addItem: invalid row/column: %d",
                 row < 0 ? row : column);
        return;
    }
    if (columnSpan < 1 || rowSpan < 1) {
        qWarning("QGraphicsGridLayout::addItem: invalid row span/column span: %d",
                 rowSpan < 1 ? rowSpan : columnSpan);
        return;
    }
    if (!item) {
        qWarning("QGraphicsGridLayout::addItem: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsGridLayout::addItem: cannot insert itself");
        return;
    }

    d->addChildLayoutItem(item);

    QGraphicsGridLayoutEngineItem *gridEngineItem = new QGraphicsGridLayoutEngineItem(item, row, column, rowSpan, columnSpan, alignment);
    d->engine.insertItem(gridEngineItem, -1);
    invalidate();
}